

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O1

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::VisitPLTerm(EExpr *__return_storage_ptr__,
             ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *this,PLTerm e)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  _Type aiVar3;
  long lVar4;
  size_type __n;
  vector<double,_std::allocator<double>_> slopes;
  vector<double,_std::allocator<double>_> breakpoints;
  vector<double,_std::allocator<double>_> local_1b8;
  vector<double,_std::allocator<double>_> local_1a0;
  void *local_188;
  undefined8 uStack_180;
  long local_178;
  void *pvStack_170;
  undefined8 local_168;
  long lStack_160;
  double local_158;
  double dStack_150;
  void *local_148;
  undefined8 uStack_140;
  long local_138;
  void *pvStack_130;
  undefined8 local_128;
  long lStack_120;
  PLSlopes local_118;
  CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
  local_d0;
  
  uVar2 = *(uint *)((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                          impl_ + 4);
  __n = (size_type)(int)uVar2;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_1b8,__n + 1,(allocator_type *)&local_d0);
  std::vector<double,_std::allocator<double>_>::vector(&local_1a0,__n,(allocator_type *)&local_d0);
  if (0 < (int)uVar2) {
    lVar4 = 0;
    do {
      *(undefined8 *)
       ((long)local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar4) =
           *(undefined8 *)
            ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_ +
             0x10 + lVar4 * 2);
      *(undefined8 *)
       ((long)local_1a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar4) =
           *(undefined8 *)
            ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_ +
             0x18 + lVar4 * 2);
      lVar4 = lVar4 + 8;
    } while ((ulong)uVar2 << 3 != lVar4);
  }
  local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish[-1] =
       *(double *)
        ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_ + 0x10
        + __n * 0x10);
  aiVar3[0] = Convert2Var(this,(Expr)((ExprBase *)
                                     ((long)e.
                                            super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.
                                            super_ExprBase.impl_ + 8))->impl_);
  PLSlopes::PLSlopes<std::vector<double,std::allocator<double>>&>
            (&local_118,&local_1a0,&local_1b8,0.0,0.0);
  local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
  slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_118.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
  slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_118.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
  slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_118.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
  breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_118.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
  breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_118.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
  breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_118.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  paVar1 = &local_d0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  local_118.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158 = local_118.X0_;
  dStack_150 = local_118.Y0_;
  local_d0.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length = 0;
  local_d0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  local_d0.super_FunctionalConstraint.result_var_ = -1;
  local_d0.super_FunctionalConstraint.ctx.value_ = CTX_NONE;
  local_178 = 0;
  pvStack_170 = (void *)0x0;
  local_188 = (void *)0x0;
  uStack_180 = 0;
  local_168 = 0;
  lStack_160 = 0;
  local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
  X0_ = local_118.X0_;
  local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
  Y0_ = local_118.Y0_;
  local_138 = 0;
  local_148 = (void *)0x0;
  uStack_140 = 0;
  lStack_120 = 0;
  pvStack_130 = (void *)0x0;
  local_128 = 0;
  local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
  x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
  x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
  x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
  y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
  y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
  y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1
  ;
  local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.args_.
  _M_elems[0] = (_Type)(_Type)aiVar3[0];
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
  ::
  AssignResult2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,mp::PLConParams,mp::NumericFunctionalConstraintTraits,mp::PLId>>
            (__return_storage_ptr__,
             (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
              *)this,&local_d0);
  if (local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.
                    super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                    params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.
                    super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                    params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.
                    super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                    params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_d0.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.
                    super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                    params_.pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.pls_.breakpoints_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.pls_.breakpoints_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p != paVar1)
  {
    operator_delete(local_d0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p
                    ,CONCAT71(local_d0.super_FunctionalConstraint.super_BasicConstraint.name_.
                              field_2._M_allocated_capacity._1_7_,
                              local_d0.super_FunctionalConstraint.super_BasicConstraint.name_.
                              field_2._M_local_buf[0]) + 1);
  }
  if (pvStack_130 != (void *)0x0) {
    operator_delete(pvStack_130,lStack_120 - (long)pvStack_130);
  }
  if (local_148 != (void *)0x0) {
    operator_delete(local_148,local_138 - (long)local_148);
  }
  if (pvStack_170 != (void *)0x0) {
    operator_delete(pvStack_170,lStack_160 - (long)pvStack_170);
  }
  if (local_188 != (void *)0x0) {
    operator_delete(local_188,local_178 - (long)local_188);
  }
  if (local_118.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.slopes_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.slopes_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.breakpoints_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.breakpoints_.super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.breakpoints_.super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

EExpr VisitPLTerm(PLTerm e) {
    int num_breakpoints = e.num_breakpoints();
    std::vector<double> slopes(num_breakpoints+1), breakpoints(num_breakpoints);
    for (int i = 0; i < num_breakpoints; ++i) {
      slopes[i] = e.slope(i);
      breakpoints[i] = e.breakpoint(i);
    }
    slopes.back() = e.slope(num_breakpoints);
    return AssignResult2Args( PLConstraint(
          PLConstraint::Arguments{ Convert2Var(e.arg()) },
          PLConstraint::Parameters{
                                  PLSlopes{
                                    breakpoints, slopes, 0.0, 0.0 } } ) );
  }